

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_header.cpp
# Opt level: O3

bool __thiscall pstore::trailer::signature_is_valid(trailer *this)

{
  return *(long *)(this->signature2)._M_elems == 0x6c69615479505068 ||
         *(long *)(this->a).signature1._M_elems == 0x546f6f6679505068;
}

Assistant:

bool trailer::signature_is_valid () const noexcept {
#if PSTORE_SIGNATURE_CHECKS_ENABLED
        return a.signature1 == trailer::default_signature1 ||
               signature2 == trailer::default_signature2;
#else
        return true;
#endif
    }